

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O3

void __thiscall Chromosome::crossover(Chromosome *this,Chromosome *other)

{
  pointer pTVar1;
  pointer pTVar2;
  result_type_conflict2 rVar3;
  pointer pTVar4;
  vector<TURNCODE,_std::allocator<TURNCODE>_> nlist2;
  vector<TURNCODE,_std::allocator<TURNCODE>_> nlist1;
  uniform_int_distribution<int> crossover;
  pointer local_68;
  pointer pTStack_60;
  pointer local_58;
  pointer local_48;
  pointer pTStack_40;
  pointer local_38;
  uniform_int_distribution<int> local_28;
  
  local_28._M_param._M_b =
       (int)((ulong)((long)(this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2) + -1;
  local_28._M_param._M_a = 1;
  rVar3 = std::uniform_int_distribution<int>::operator()
                    (&local_28,&randomDevice2,&local_28._M_param);
  pTVar1 = (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = pTVar1 + rVar3;
  pTVar4 = (other->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_start + rVar3;
  local_38 = (pointer)0x0;
  local_48 = (pointer)0x0;
  pTStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  local_68 = (pointer)0x0;
  pTStack_60 = (pointer)0x0;
  std::vector<TURNCODE,std::allocator<TURNCODE>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>>
            ((vector<TURNCODE,std::allocator<TURNCODE>> *)&local_48,0,pTVar1,pTVar2);
  std::vector<TURNCODE,std::allocator<TURNCODE>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>>
            ((vector<TURNCODE,std::allocator<TURNCODE>> *)&local_48,pTStack_40,pTVar4,
             (other->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<TURNCODE,std::allocator<TURNCODE>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>>
            ((vector<TURNCODE,std::allocator<TURNCODE>> *)&local_68,0,
             (other->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
             super__Vector_impl_data._M_start,pTVar4);
  std::vector<TURNCODE,std::allocator<TURNCODE>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<TURNCODE*,std::vector<TURNCODE,std::allocator<TURNCODE>>>>
            ((vector<TURNCODE,std::allocator<TURNCODE>> *)&local_68,pTStack_60,pTVar2,
             (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pTVar2 = (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
  super__Vector_impl_data._M_start = local_48;
  (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
  super__Vector_impl_data._M_finish = pTStack_40;
  (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  local_48 = (pointer)0x0;
  pTStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)pTVar1 - (long)pTVar2);
  }
  pTVar2 = (other->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (other->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (other->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
  super__Vector_impl_data._M_start = local_68;
  (other->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
  super__Vector_impl_data._M_finish = pTStack_60;
  (other->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_58;
  local_68 = (pointer)0x0;
  pTStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)pTVar1 - (long)pTVar2);
  }
  this->changed = true;
  this->id = idGlobal + 1;
  other->changed = true;
  idGlobal = idGlobal + 2;
  other->id = idGlobal;
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

void Chromosome::crossover(Chromosome& other) {

    std::uniform_int_distribution<int> crossover(1, turnList.size()-1);
    int position =  crossover(randomDevice2);

    std::vector<TURNCODE>& list1 = this->turnList;
    std::vector<TURNCODE>& list2 = other.turnList;

    auto it1 = list1.begin();
    std::advance(it1, position);
    auto it2 = list2.begin();
    std::advance(it2, position);

    std::vector<TURNCODE> nlist1;
    std::vector<TURNCODE> nlist2;
    nlist1.insert(nlist1.begin(), list1.begin(), it1);
    nlist1.insert(nlist1.end(), it2, list2.end());
    nlist2.insert(nlist2.begin(), list2.begin(), it2);
    nlist2.insert(nlist2.end(), it1, list1.end());

    list1 = std::move(nlist1);
    list2 = std::move(nlist2);


    // Mark as changed for recalculation of fitness, collusion, path etc.
    this->changed = true;
    this->setId();
    other.changed = true;
    other.setId();
}